

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaJsonWriter::ContinueString(VmaJsonWriter *this,char *pStr)

{
  char cVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  size_t sVar2;
  size_t sVar3;
  char *pStr_00;
  VmaStringBuilder *this_01;
  size_t sVar4;
  
  sVar3 = strlen(pStr);
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      cVar1 = pStr[sVar4];
      if (cVar1 == '\"') {
        this_01 = this->m_SB;
        pStr_00 = "\\\"";
LAB_001b8912:
        VmaStringBuilder::Add(this_01,pStr_00);
      }
      else {
        if (cVar1 == '\\') {
          this_01 = this->m_SB;
          pStr_00 = "\\\\";
          goto LAB_001b8912;
        }
        if (cVar1 < ' ') {
          switch(cVar1) {
          case '\b':
            this_01 = this->m_SB;
            pStr_00 = "\\b";
            break;
          case '\t':
            this_01 = this->m_SB;
            pStr_00 = "\\t";
            break;
          case '\n':
            this_01 = this->m_SB;
            pStr_00 = "\\n";
            break;
          default:
            goto switchD_001b8976_caseD_b;
          case '\f':
            this_01 = this->m_SB;
            pStr_00 = "\\f";
            break;
          case '\r':
            this_01 = this->m_SB;
            pStr_00 = "\\r";
          }
          goto LAB_001b8912;
        }
        this_00 = &this->m_SB->m_Data;
        sVar2 = this_00->m_Count;
        VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar2 + 1);
        this_00->m_pArray[sVar2] = cVar1;
      }
switchD_001b8976_caseD_b:
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  return;
}

Assistant:

void VmaJsonWriter::ContinueString(const char* pStr)
{
    VMA_ASSERT(m_InsideString);

    const size_t strLen = strlen(pStr);
    for (size_t i = 0; i < strLen; ++i)
    {
        char ch = pStr[i];
        if (ch == '\\')
        {
            m_SB.Add("\\\\");
        }
        else if (ch == '"')
        {
            m_SB.Add("\\\"");
        }
        else if (ch >= 32)
        {
            m_SB.Add(ch);
        }
        else switch (ch)
        {
        case '\b':
            m_SB.Add("\\b");
            break;
        case '\f':
            m_SB.Add("\\f");
            break;
        case '\n':
            m_SB.Add("\\n");
            break;
        case '\r':
            m_SB.Add("\\r");
            break;
        case '\t':
            m_SB.Add("\\t");
            break;
        default:
            VMA_ASSERT(0 && "Character not currently supported.");
            break;
        }
    }
}